

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort_impl.h
# Opt level: O3

void secp256k1_heap_down(uchar *arr,size_t i,size_t heap_size,size_t stride,
                        _func_int_void_ptr_void_ptr_void_ptr *cmp,void *cmp_data)

{
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  undefined8 uVar4;
  uchar *puVar5;
  int iVar6;
  byte *pbVar7;
  byte *extraout_RDX;
  uchar *sigend;
  uchar *unaff_RBP;
  secp256k1_pubkey *pubkey0;
  char *__src;
  secp256k1_context *ctx;
  secp256k1_context *r;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uStack_a8;
  int iStack_9c;
  uchar auStack_98 [40];
  size_t sStack_70;
  ulong uStack_68;
  uchar *puStack_60;
  code *pcStack_58;
  code *pcStack_50;
  size_t local_48;
  secp256k1_context *local_40;
  ulong local_38;
  
  local_38 = heap_size >> 1;
  pubkey0 = (secp256k1_pubkey *)i;
  r = (secp256k1_context *)arr;
  local_48 = heap_size;
  local_40 = (secp256k1_context *)stride;
  if (i < local_38) {
    do {
      ctx = local_40;
      uVar9 = i * 2 + 1;
      if (heap_size <= uVar9) {
        pcStack_50 = secp256k1_der_read_len;
        secp256k1_heap_down_cold_1();
        if (r != (secp256k1_context *)0x0) {
          (r->ecmult_gen_ctx).built = 0;
          (r->ecmult_gen_ctx).scalar_offset = 0;
          pbVar7 = *(byte **)pubkey0->data;
          if (pbVar7 < extraout_RDX) {
            pbVar1 = pbVar7 + 1;
            *(byte **)pubkey0->data = pbVar1;
            bVar2 = *pbVar7;
            uVar9 = (ulong)bVar2;
            if (uVar9 != 0xff) {
              if ((char)bVar2 < '\0') {
                if (bVar2 != 0x80) {
                  uVar8 = bVar2 & 0x7f;
                  uVar9 = (ulong)uVar8;
                  if ((((uVar9 <= (ulong)((long)extraout_RDX - (long)pbVar1)) && ((byte)uVar8 < 9))
                      && (*pbVar1 != 0)) && (uVar9 != 0)) {
                    pbVar7 = pbVar7 + 2;
                    uVar11 = 0;
                    uVar10 = 0;
                    do {
                      uVar10 = (ulong)pbVar7[-1] | uVar10 << 8;
                      (r->ecmult_gen_ctx).built = (int)uVar10;
                      (r->ecmult_gen_ctx).scalar_offset = (int)(uVar10 >> 0x20);
                      *(byte **)pubkey0->data = pbVar7;
                      pbVar7 = pbVar7 + 1;
                      uVar11 = uVar11 + 1;
                    } while (uVar9 != uVar11);
                  }
                }
              }
              else {
                (r->ecmult_gen_ctx).built = (int)uVar9;
                (r->ecmult_gen_ctx).scalar_offset = (int)(uVar9 >> 0x20);
              }
            }
          }
          return;
        }
        pcStack_58 = secp256k1_der_parse_integer;
        secp256k1_der_read_len_cold_1();
        iStack_9c = 0;
        auStack_98[0x10] = '\0';
        auStack_98[0x11] = '\0';
        auStack_98[0x12] = '\0';
        auStack_98[0x13] = '\0';
        auStack_98[0x14] = '\0';
        auStack_98[0x15] = '\0';
        auStack_98[0x16] = '\0';
        auStack_98[0x17] = '\0';
        auStack_98[0x18] = '\0';
        auStack_98[0x19] = '\0';
        auStack_98[0x1a] = '\0';
        auStack_98[0x1b] = '\0';
        auStack_98[0x1c] = '\0';
        auStack_98[0x1d] = '\0';
        auStack_98[0x1e] = '\0';
        auStack_98[0x1f] = '\0';
        auStack_98[0] = '\0';
        auStack_98[1] = '\0';
        auStack_98[2] = '\0';
        auStack_98[3] = '\0';
        auStack_98[4] = '\0';
        auStack_98[5] = '\0';
        auStack_98[6] = '\0';
        auStack_98[7] = '\0';
        auStack_98[8] = '\0';
        auStack_98[9] = '\0';
        auStack_98[10] = '\0';
        auStack_98[0xb] = '\0';
        auStack_98[0xc] = '\0';
        auStack_98[0xd] = '\0';
        auStack_98[0xe] = '\0';
        auStack_98[0xf] = '\0';
        puVar5 = *(uchar **)pubkey0->data;
        if (puVar5 == sigend) {
          return;
        }
        if (*puVar5 != '\x02') {
          return;
        }
        *(uchar **)pubkey0->data = puVar5 + 1;
        sStack_70 = i;
        uStack_68 = heap_size;
        puStack_60 = arr;
        pcStack_58 = (code *)unaff_RBP;
        iVar6 = secp256k1_der_read_len(&uStack_a8,(uchar **)pubkey0,sigend);
        if (iVar6 == 0) {
          return;
        }
        if (uStack_a8 == 0) {
          return;
        }
        __src = *(char **)pubkey0->data;
        if ((ulong)((long)sigend - (long)__src) < uStack_a8) {
          return;
        }
        cVar3 = *__src;
        if (uStack_a8 == 1 || cVar3 != '\0') {
          if (cVar3 == -1 && uStack_a8 != 1) {
            if (__src[1] < '\0') {
              return;
            }
          }
          else if (-1 < cVar3) {
            if (cVar3 == '\0') goto LAB_0011726d;
            goto LAB_0011727a;
          }
        }
        else {
          if (-1 < __src[1]) {
            return;
          }
LAB_0011726d:
          uStack_a8 = uStack_a8 - 1;
          __src = __src + 1;
          *(char **)pubkey0->data = __src;
LAB_0011727a:
          if (uStack_a8 < 0x21) {
            if (uStack_a8 != 0) {
              memcpy(auStack_98 + (0x20 - uStack_a8),__src,uStack_a8);
            }
            secp256k1_scalar_set_b32((secp256k1_scalar *)r,auStack_98,&iStack_9c);
            if (iStack_9c == 0) goto LAB_001172b8;
          }
        }
        (r->ecmult_gen_ctx).built = 0;
LAB_001172b8:
        *(ulong *)pubkey0->data = *(long *)pubkey0->data + uStack_a8;
        return;
      }
      uVar11 = i * 2 + 2;
      if (uVar11 < heap_size) {
        pcStack_50 = (code *)0x117081;
        iVar6 = secp256k1_ec_pubkey_cmp
                          (local_40,*(secp256k1_pubkey **)(arr + uVar11 * 8),
                           *(secp256k1_pubkey **)(arr + uVar9 * 8));
        heap_size = local_48;
        if (iVar6 < 0) goto LAB_001170c5;
        unaff_RBP = arr + uVar11 * 8;
        pubkey0 = *(secp256k1_pubkey **)unaff_RBP;
        pcStack_50 = (code *)0x117099;
        iVar6 = secp256k1_ec_pubkey_cmp(ctx,pubkey0,*(secp256k1_pubkey **)(arr + i * 8));
        heap_size = local_48;
        if (iVar6 < 1) {
          return;
        }
      }
      else {
LAB_001170c5:
        pubkey0 = *(secp256k1_pubkey **)(arr + uVar9 * 8);
        pcStack_50 = (code *)0x1170d2;
        iVar6 = secp256k1_ec_pubkey_cmp(ctx,pubkey0,*(secp256k1_pubkey **)(arr + i * 8));
        if (iVar6 < 1) {
          return;
        }
        unaff_RBP = arr + uVar9 * 8;
        uVar11 = uVar9;
      }
      uVar4 = *(undefined8 *)(arr + i * 8);
      *(undefined8 *)(arr + i * 8) = *(undefined8 *)unaff_RBP;
      *(undefined8 *)unaff_RBP = uVar4;
      i = uVar11;
      r = ctx;
    } while (uVar11 < local_38);
  }
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_heap_down(unsigned char *arr, size_t i, size_t heap_size, size_t stride,
                            int (*cmp)(const void *, const void *, void *), void *cmp_data) {
    while (i < heap_size/2) {
        VERIFY_CHECK(i <= SIZE_MAX/2 - 1);
        /* Proof:
         * i < heap_size/2
         * i + 1 <= heap_size/2
         * 2*i + 2 <= heap_size <= SIZE_MAX
         * 2*i <= SIZE_MAX - 2
         */

        VERIFY_CHECK(secp256k1_heap_child1(i) < heap_size);
        /* Proof:
         * i < heap_size/2
         * i + 1 <= heap_size/2
         * 2*i + 2 <= heap_size
         * 2*i + 1 < heap_size
         * child1(i) < heap_size
         */

        /* Let [x] be notation for the contents at arr[x*stride].
         *
         * If [child1(i)] > [i] and [child2(i)] > [i],
         *   swap [i] with the larger child to ensure the new parent is larger
         *   than both children. When [child1(i)] == [child2(i)], swap [i] with
         *   [child2(i)].
         * Else if [child1(i)] > [i], swap [i] with [child1(i)].
         * Else if [child2(i)] > [i], swap [i] with [child2(i)].
         */
        if (secp256k1_heap_child2(i) < heap_size
                && 0 <= cmp(arr + secp256k1_heap_child2(i)*stride, arr + secp256k1_heap_child1(i)*stride, cmp_data)) {
            if (0 < cmp(arr + secp256k1_heap_child2(i)*stride, arr + i*stride, cmp_data)) {
                secp256k1_heap_swap(arr, i, secp256k1_heap_child2(i), stride);
                i = secp256k1_heap_child2(i);
            } else {
                /* At this point we have [child2(i)] >= [child1(i)] and we have
                 * [child2(i)] <= [i], and thus [child1(i)] <= [i] which means
                 * that the next comparison can be skipped. */
                return;
            }
        } else if (0 < cmp(arr + secp256k1_heap_child1(i)*stride, arr +         i*stride, cmp_data)) {
            secp256k1_heap_swap(arr, i, secp256k1_heap_child1(i), stride);
            i = secp256k1_heap_child1(i);
        } else {
            return;
        }
    }
    /* heap_size/2 <= i
     * heap_size/2 < i + 1
     * heap_size < 2*i + 2
     * heap_size <= 2*i + 1
     * heap_size <= child1(i)
     * Thus child1(i) and child2(i) are now out of bounds and we are at a leaf.
     */
}